

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Maybe<const_capnp::word_&> __thiscall
capnp::_::WireHelpers::followFars
          (WireHelpers *this,WirePointer **ref,word *refTarget,SegmentReader **segment)

{
  bool bVar1;
  Kind KVar2;
  int iVar3;
  Arena *pAVar4;
  undefined4 extraout_var;
  SegmentReader *start;
  word *pwVar5;
  undefined4 extraout_var_00;
  Fault local_188;
  Fault f_4;
  word **local_178;
  undefined1 local_170 [8];
  DebugComparison<const_capnp::word_*&,_std::nullptr_t> _kjCondition_4;
  Fault local_140;
  Fault f_3;
  Kind local_130;
  DebugExpression<capnp::_::WirePointer::Kind> local_12c;
  undefined1 local_128 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition_3;
  Fault local_100;
  Fault f_2;
  SegmentReader **local_f0;
  undefined1 local_e8 [8];
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition_2;
  SegmentReader *local_b8;
  SegmentReader *newSegment;
  WirePointer *pad;
  Fault local_a0;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  uint padWords;
  word *ptr;
  Fault local_70;
  Fault f;
  SegmentReader **local_60;
  undefined1 local_58 [8];
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentReader **segment_local;
  word *refTarget_local;
  WirePointer **ref_local;
  
  segment_local = (SegmentReader **)refTarget;
  refTarget_local = (word *)ref;
  ref_local = (WirePointer **)this;
  if ((*segment == (SegmentReader *)0x0) || (KVar2 = WirePointer::kind(*ref), KVar2 != FAR)) {
    local_178 = (word **)kj::_::DebugExpressionStart::operator<<
                                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                    (word **)&segment_local);
    f_4.exception = (Exception *)0x0;
    kj::_::DebugExpression<capnp::word_const*&>::operator!=
              ((DebugComparison<const_capnp::word_*&,_std::nullptr_t> *)local_170,
               (DebugExpression<capnp::word_const*&> *)&local_178,&f_4.exception);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_170);
    if (bVar1) {
      kj::Maybe<const_capnp::word_&>::Maybe
                ((Maybe<const_capnp::word_&> *)this,(word *)segment_local);
      return (Maybe<const_capnp::word_&>)(word *)this;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word_const*&,decltype(nullptr)>&>
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x26a,FAILED,"refTarget != nullptr","_kjCondition,",
               (DebugComparison<const_capnp::word_*&,_std::nullptr_t> *)local_170);
    kj::_::Debug::Fault::fatal(&local_188);
  }
  pAVar4 = SegmentReader::getArena(*segment);
  _kjCondition._36_4_ =
       DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_>::get
                 ((DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_> *)
                  (refTarget_local->content + 4));
  iVar3 = (*pAVar4->_vptr_Arena[2])(pAVar4,(ulong)(uint)_kjCondition._36_4_);
  *segment = (SegmentReader *)CONCAT44(extraout_var,iVar3);
  local_60 = (SegmentReader **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,segment);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<capnp::_::SegmentReader*&>::operator!=
            ((DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)local_58,
             (DebugExpression<capnp::_::SegmentReader*&> *)&local_60,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x244,FAILED,"segment != nullptr",
               "_kjCondition,\"Message contains far pointer to unknown segment.\"",
               (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)local_58,
               (char (*) [49])"Message contains far pointer to unknown segment.");
    kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)this);
    kj::_::Debug::Fault::~Fault(&local_70);
    return (Maybe<const_capnp::word_&>)(word *)this;
  }
  start = (SegmentReader *)WirePointer::farTarget((WirePointer *)refTarget_local->content,*segment);
  bVar1 = WirePointer::isDoubleFar((WirePointer *)refTarget_local->content);
  bVar1 = bounded<bool>(bVar1);
  f_1.exception._4_4_ = bVar1 + 1;
  f_1.exception._2_1_ = boundsCheck(*segment,(word *)start,f_1.exception._4_4_);
  f_1.exception._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 2));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&f_1.exception + 3));
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
              (&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
               "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
               ,(DebugExpression<bool> *)((long)&f_1.exception + 3),
               (char (*) [318])
               "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
              );
    kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)this);
    kj::_::Debug::Fault::~Fault(&local_a0);
    return (Maybe<const_capnp::word_&>)(word *)this;
  }
  newSegment = start;
  bVar1 = WirePointer::isDoubleFar((WirePointer *)refTarget_local->content);
  if (!bVar1) {
    refTarget_local->content = (uint64_t)newSegment;
    pwVar5 = WirePointer::target((WirePointer *)newSegment,*segment);
    kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)this,pwVar5);
    return (Maybe<const_capnp::word_&>)(word *)this;
  }
  refTarget_local->content = (uint64_t)&newSegment->id;
  pAVar4 = SegmentReader::getArena(*segment);
  _kjCondition_2._36_4_ =
       DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_>::get
                 ((DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_> *)
                  ((long)&newSegment->arena + 4));
  iVar3 = (*pAVar4->_vptr_Arena[2])(pAVar4,(ulong)(uint)_kjCondition_2._36_4_);
  local_b8 = (SegmentReader *)CONCAT44(extraout_var_00,iVar3);
  local_f0 = (SegmentReader **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b8);
  f_2.exception = (Exception *)0x0;
  kj::_::DebugExpression<capnp::_::SegmentReader*&>::operator!=
            ((DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)local_e8,
             (DebugExpression<capnp::_::SegmentReader*&> *)&local_f0,&f_2.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e8);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
              (&local_100,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x25f,FAILED,"newSegment != nullptr",
               "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
               (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)local_e8,
               (char (*) [56])"Message contains double-far pointer to unknown segment.");
    kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)this);
    kj::_::Debug::Fault::~Fault(&local_100);
    return (Maybe<const_capnp::word_&>)(word *)this;
  }
  local_130 = WirePointer::kind((WirePointer *)newSegment);
  local_12c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_130);
  f_3.exception._4_4_ = 2;
  kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
            ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)local_128,
             &local_12c,(Kind *)((long)&f_3.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_128);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
              (&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
               "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
               (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
               local_128,(char (*) [51])"Second word of double-far pad must be far pointer.");
    kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)this);
    kj::_::Debug::Fault::~Fault(&local_140);
    return (Maybe<const_capnp::word_&>)(word *)this;
  }
  *segment = local_b8;
  pwVar5 = WirePointer::farTarget((WirePointer *)newSegment,*segment);
  kj::Maybe<const_capnp::word_&>::Maybe((Maybe<const_capnp::word_&> *)this,pwVar5);
  return (Maybe<const_capnp::word_&>)(word *)this;
}

Assistant:

static KJ_ALWAYS_INLINE(kj::Maybe<const word&> followFars(
      const WirePointer*& ref, const word* refTarget, SegmentReader*& segment))
      KJ_WARN_UNUSED_RESULT {
    // Like the other followFars() but operates on readers.

    // If the segment is null, this is an unchecked message, so there are no FAR pointers.
    if (segment != nullptr && ref->kind() == WirePointer::FAR) {
      // Look up the segment containing the landing pad.
      segment = segment->getArena()->tryGetSegment(ref->farRef.segmentId.get());
      KJ_REQUIRE(segment != nullptr, "Message contains far pointer to unknown segment.") {
        return kj::none;
      }

      // Find the landing pad and check that it is within bounds.
      const word* ptr = ref->farTarget(segment);
      auto padWords = (ONE + bounded(ref->isDoubleFar())) * POINTER_SIZE_IN_WORDS;
      KJ_REQUIRE(boundsCheck(segment, ptr, padWords),
                 "Message contains out-of-bounds far pointer. "
                 OUT_OF_BOUNDS_ERROR_DETAIL) {
        return kj::none;
      }

      const WirePointer* pad = reinterpret_cast<const WirePointer*>(ptr);

      // If this is not a double-far then the landing pad is our final pointer.
      if (!ref->isDoubleFar()) {
        ref = pad;
        return pad->target(segment);
      }

      // Landing pad is another far pointer.  It is followed by a tag describing the pointed-to
      // object.
      ref = pad + 1;

      SegmentReader* newSegment = segment->getArena()->tryGetSegment(pad->farRef.segmentId.get());
      KJ_REQUIRE(newSegment != nullptr,
          "Message contains double-far pointer to unknown segment.") {
        return kj::none;
      }
      KJ_REQUIRE(pad->kind() == WirePointer::FAR,
          "Second word of double-far pad must be far pointer.") {
        return kj::none;
      }

      segment = newSegment;
      return pad->farTarget(segment);
    } else {
      KJ_DASSERT(refTarget != nullptr);
      return refTarget;
    }
  }